

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O2

void __thiscall slang::parsing::Lexer::scanWhitespace(Lexer *this)

{
  byte *pbVar1;
  
  pbVar1 = (byte *)this->sourceBuffer;
  while( true ) {
    if ((0x20 < (ulong)*pbVar1) || ((0x100001a00U >> ((ulong)*pbVar1 & 0x3f) & 1) == 0)) break;
    this->sourceBuffer = (char *)(pbVar1 + 1);
    pbVar1 = pbVar1 + 1;
  }
  addTrivia(this,Whitespace);
  return;
}

Assistant:

void Lexer::scanWhitespace() {
    bool done = false;
    while (!done) {
        switch (peek()) {
            case ' ':
            case '\t':
            case '\v':
            case '\f':
                advance();
                break;
            default:
                done = true;
                break;
        }
    }
    addTrivia(TriviaKind::Whitespace);
}